

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SelectLeaf(Fts3Table *p,char *zTerm,int nTerm,char *zNode,int nNode,sqlite3_int64 *piLeaf,
                  sqlite3_int64 *piLeaf2)

{
  sqlite3_uint64 n;
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  void *__s2;
  sqlite3_int64 *psVar7;
  long lVar8;
  char *pcVar9;
  void *pOld;
  undefined4 in_register_00000084;
  int *pnLoad;
  size_t __n;
  char *pcVar10;
  int nSuffix;
  sqlite3_int64 iChild;
  int local_78;
  int local_74;
  sqlite3_int64 *local_70;
  Fts3Table *local_68;
  int iHeight;
  char *local_58;
  sqlite3_int64 *local_50;
  sqlite3_uint64 local_48;
  char *local_40;
  sqlite3_int64 *local_38;
  
  pnLoad = (int *)CONCAT44(in_register_00000084,nNode);
  local_78 = nTerm;
  iVar3 = (int)*zNode;
  local_58 = zTerm;
  if (*zNode < '\0') {
    sqlite3Fts3GetVarint32(zNode,&iHeight);
    iVar3 = iHeight;
  }
  iHeight = iVar3;
  pcVar9 = zNode + nNode;
  iVar3 = sqlite3Fts3GetVarint(zNode,&iChild);
  local_40 = zNode;
  iVar4 = sqlite3Fts3GetVarint(zNode + iVar3,&iChild);
  pcVar10 = zNode + iVar3 + iVar4;
  iVar3 = 0x10b;
  if (pcVar10 <= pcVar9) {
    local_48 = 0;
    bVar2 = false;
    psVar7 = piLeaf2;
    pOld = (void *)0x0;
    local_70 = piLeaf;
    local_68 = p;
    for (; pcVar10 < pcVar9; pcVar10 = pcVar10 + __n) {
      if (piLeaf == (sqlite3_int64 *)0x0 && psVar7 == (sqlite3_int64 *)0x0) {
        iVar3 = 0;
        goto LAB_0019e959;
      }
      local_74 = 0;
      local_38 = piLeaf;
      if (bVar2) {
        if (*pcVar10 < '\0') {
          uVar5 = sqlite3Fts3GetVarint32(pcVar10,&local_74);
          uVar6 = (ulong)uVar5;
        }
        else {
          uVar6 = 1;
          local_74 = (int)*pcVar10;
        }
        pcVar10 = pcVar10 + uVar6;
      }
      local_50 = psVar7;
      if (*pcVar10 < '\0') {
        uVar5 = sqlite3Fts3GetVarint32(pcVar10,&nSuffix);
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = 1;
        nSuffix = (int)*pcVar10;
      }
      iVar4 = local_74;
      iVar3 = nSuffix;
      pcVar10 = pcVar10 + uVar6;
      lVar8 = (long)local_74;
      if ((((long)pcVar10 - (long)local_40 < lVar8) || (__n = (size_t)nSuffix, __n == 0)) ||
         ((long)pcVar9 - (long)pcVar10 < (long)__n)) {
        iVar3 = 0x10b;
        goto LAB_0019e959;
      }
      __s2 = pOld;
      if ((long)local_48 < (long)(__n + lVar8)) {
        n = (__n + lVar8) * 2;
        __s2 = sqlite3_realloc64(pOld,n);
        local_48 = n;
        if (__s2 == (void *)0x0) {
          iVar3 = 7;
          goto LAB_0019e959;
        }
      }
      memcpy((void *)(lVar8 + (long)__s2),pcVar10,__n);
      iVar1 = local_78;
      iVar4 = iVar4 + iVar3;
      iVar3 = local_78;
      if (iVar4 < local_78) {
        iVar3 = iVar4;
      }
      iVar3 = memcmp(local_58,__s2,(long)iVar3);
      psVar7 = local_50;
      if (local_38 == (sqlite3_int64 *)0x0) {
LAB_0019e8fb:
        if ((local_50 == (sqlite3_int64 *)0x0) || (-1 < iVar3)) {
          piLeaf = (sqlite3_int64 *)0x0;
        }
        else {
          *local_50 = iChild;
          psVar7 = (sqlite3_int64 *)0x0;
          piLeaf = (sqlite3_int64 *)0x0;
        }
      }
      else if ((iVar3 < 0) || (piLeaf = local_38, iVar1 < iVar4 && iVar3 == 0)) {
        *local_38 = iChild;
        goto LAB_0019e8fb;
      }
      iChild = iChild + 1;
      bVar2 = true;
      pOld = __s2;
    }
    if (piLeaf != (sqlite3_int64 *)0x0) {
      *piLeaf = iChild;
    }
    iVar3 = 0;
    if (psVar7 != (sqlite3_int64 *)0x0) {
      *psVar7 = iChild;
      iVar3 = 0;
    }
LAB_0019e959:
    p = local_68;
    piLeaf = local_70;
    sqlite3_free(pOld);
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  if (iHeight < 2) {
    return 0;
  }
  iChild = 0;
  nSuffix = 0;
  if ((piLeaf2 != (sqlite3_int64 *)0x0 && piLeaf != (sqlite3_int64 *)0x0) && (*piLeaf != *piLeaf2))
  {
    iVar3 = sqlite3Fts3ReadBlock(p,*piLeaf,(char **)&iChild,&nSuffix,pnLoad);
    if (iVar3 == 0) {
      pnLoad = (int *)(ulong)(uint)nSuffix;
      iVar3 = fts3SelectLeaf(p,local_58,local_78,(char *)iChild,nSuffix,piLeaf,(sqlite3_int64 *)0x0)
      ;
    }
    sqlite3_free((void *)iChild);
    iChild = 0;
    piLeaf = (sqlite3_int64 *)0x0;
    if (iVar3 != 0) goto LAB_0019ea5a;
  }
  iChild = 0;
  psVar7 = piLeaf;
  if (piLeaf == (sqlite3_int64 *)0x0) {
    psVar7 = piLeaf2;
  }
  iVar3 = sqlite3Fts3ReadBlock(p,*psVar7,(char **)&iChild,&nSuffix,pnLoad);
  if (iVar3 == 0) {
    iVar3 = fts3SelectLeaf(p,local_58,local_78,(char *)iChild,nSuffix,piLeaf,piLeaf2);
  }
LAB_0019ea5a:
  sqlite3_free((void *)iChild);
  return iVar3;
}

Assistant:

static int fts3SelectLeaf(
  Fts3Table *p,                   /* Virtual table handle */
  const char *zTerm,              /* Term to select leaves for */
  int nTerm,                      /* Size of term zTerm in bytes */
  const char *zNode,              /* Buffer containing segment interior node */
  int nNode,                      /* Size of buffer at zNode */
  sqlite3_int64 *piLeaf,          /* Selected leaf node */
  sqlite3_int64 *piLeaf2          /* Selected leaf node */
){
  int rc = SQLITE_OK;             /* Return code */
  int iHeight;                    /* Height of this node in tree */

  assert( piLeaf || piLeaf2 );

  fts3GetVarint32(zNode, &iHeight);
  rc = fts3ScanInteriorNode(zTerm, nTerm, zNode, nNode, piLeaf, piLeaf2);
  assert( !piLeaf2 || !piLeaf || rc!=SQLITE_OK || (*piLeaf<=*piLeaf2) );

  if( rc==SQLITE_OK && iHeight>1 ){
    char *zBlob = 0;              /* Blob read from %_segments table */
    int nBlob = 0;                /* Size of zBlob in bytes */

    if( piLeaf && piLeaf2 && (*piLeaf!=*piLeaf2) ){
      rc = sqlite3Fts3ReadBlock(p, *piLeaf, &zBlob, &nBlob, 0);
      if( rc==SQLITE_OK ){
        rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, 0);
      }
      sqlite3_free(zBlob);
      piLeaf = 0;
      zBlob = 0;
    }

    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3ReadBlock(p, piLeaf?*piLeaf:*piLeaf2, &zBlob, &nBlob, 0);
    }
    if( rc==SQLITE_OK ){
      rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, piLeaf2);
    }
    sqlite3_free(zBlob);
  }

  return rc;
}